

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void pnga_matmul_mirrored
               (char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
               Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
               Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
               Integer cjhi)

{
  double dVar1;
  int iVar2;
  void *pvVar3;
  Integer IVar4;
  logical lVar5;
  logical lVar6;
  Integer IVar7;
  ulong uVar8;
  void *pvVar9;
  long lVar10;
  void *buf;
  undefined8 *buf_00;
  long lVar11;
  undefined8 *puVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  Integer *pIVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  double dVar24;
  long local_1e8;
  Integer avail;
  long local_1d0;
  void *local_1c0;
  Integer atype;
  Integer local_1b0;
  Integer local_1a8;
  Integer local_1a0;
  byte *local_198;
  byte *local_190;
  long local_188;
  long local_180;
  Integer dims [2];
  undefined8 local_158;
  void *local_150;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  Integer kdim;
  long local_110;
  long local_108;
  Integer local_100;
  Integer jdim;
  int local_ec;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  Integer local_a8;
  Integer cdim;
  Integer idim;
  Integer rank;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  Integer ctype;
  Integer btype;
  
  local_1b0 = g_a;
  local_1a0 = ailo;
  local_198 = (byte *)transb;
  local_190 = (byte *)transa;
  local_150 = alpha;
  IVar4 = pnga_nodeid();
  iVar2 = _ga_sync_end;
  local_88 = 0x3ff0000000000000;
  uStack_80 = 0;
  local_158 = 0x3f800000;
  bVar22 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar22) {
    pnga_sync();
  }
  lVar5 = pnga_is_mirrored(local_1b0);
  lVar6 = pnga_is_mirrored(g_b);
  if (lVar5 == lVar6) {
    lVar5 = pnga_is_mirrored(local_1b0);
    lVar6 = pnga_is_mirrored(g_c);
    if (lVar5 != lVar6) goto LAB_0013476c;
  }
  else {
LAB_0013476c:
    IVar7 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar7);
  }
  lVar5 = pnga_is_mirrored(local_1b0);
  if (lVar5 == 0) {
    local_100 = pnga_nnodes();
  }
  else {
    IVar7 = pnga_cluster_nodeid();
    local_100 = pnga_cluster_nprocs(IVar7);
    IVar7 = pnga_cluster_procid(IVar7,0);
    IVar4 = IVar4 - IVar7;
  }
  pnga_inquire(local_1b0,&atype,&rank,dims);
  local_1a8 = IVar4;
  if (rank < 3) {
    lVar13 = dims[0];
    if (rank == 1) {
      local_1e8 = 1;
      if (aihi <= local_1a0) {
        lVar13 = local_1e8;
        local_1e8 = dims[0];
      }
    }
    else {
      if (rank != 2) {
        pcVar14 = "rank must be atleast 1";
        goto LAB_0013484d;
      }
      local_1e8 = dims[1];
    }
  }
  else {
    pcVar14 = "rank is greater than 2";
LAB_0013484d:
    pnga_error(pcVar14,rank);
    local_1e8 = 0;
    lVar13 = 0;
  }
  pnga_inquire(g_b,&btype,&rank,dims);
  local_ec = iVar2;
  if (rank < 3) {
    lVar18 = dims[0];
    if (rank == 1) {
      lVar10 = 1;
      if (bihi <= bilo) {
        lVar18 = lVar10;
        lVar10 = dims[0];
      }
    }
    else {
      lVar10 = dims[1];
      if (rank != 2) {
        pcVar14 = "rank must be atleast 1";
        goto LAB_001348df;
      }
    }
  }
  else {
    pcVar14 = "rank is greater than 2";
LAB_001348df:
    pnga_error(pcVar14,rank);
    lVar18 = 0;
    lVar10 = 0;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  if (rank < 3) {
    lVar21 = dims[0];
    if (rank == 1) {
      lVar19 = 1;
      if (cihi <= cilo) {
        lVar21 = lVar19;
        lVar19 = dims[0];
      }
    }
    else {
      lVar19 = dims[1];
      if (rank != 2) {
        pcVar14 = "rank must be atleast 1";
        goto LAB_00134964;
      }
    }
  }
  else {
    pcVar14 = "rank is greater than 2";
LAB_00134964:
    pnga_error(pcVar14,rank);
    lVar21 = 0;
    lVar19 = 0;
  }
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  if ((4 < atype - 0x3ebU) || (atype - 0x3ebU == 2)) {
    pnga_error(" type error",atype);
  }
  if ((*local_190 | 0x20) == 0x6e) {
    if ((local_1a0 < 1) || (local_1e8 < ajhi || (ajlo < 1 || lVar13 < aihi))) {
LAB_00134a31:
      pnga_error("  g_a indices out of range ",local_1b0);
    }
  }
  else if ((local_1a0 < 1) || (lVar13 < ajhi || (ajlo < 1 || local_1e8 < aihi))) goto LAB_00134a31;
  if ((*local_198 | 0x20) == 0x6e) {
    if ((bilo < 1) || (lVar10 < bjhi || (bjlo < 1 || lVar18 < bihi))) {
LAB_00134ab0:
      pnga_error("  g_b indices out of range ",g_b);
    }
  }
  else if ((bilo < 1) || (lVar18 < bjhi || (bjlo < 1 || lVar10 < bihi))) goto LAB_00134ab0;
  if ((((cilo < 1) || (cjlo < 1)) || (lVar21 < cihi)) || (lVar19 < cjhi)) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  local_c0 = aihi - local_1a0;
  lVar13 = local_c0 + 1;
  lVar18 = bjhi - bjlo;
  if (cihi - cilo != local_c0) {
    pnga_error(" a & c dims error",lVar13);
  }
  lVar21 = ajhi - ajlo;
  lVar10 = lVar18 + 1;
  if (cjhi - cjlo != lVar18) {
    pnga_error(" b & c dims error",lVar10);
  }
  lVar19 = lVar21 + 1;
  local_108 = lVar21;
  if (bihi - bilo != lVar21) {
    pnga_error(" a & b dims error",lVar19);
  }
  local_70 = lVar18;
  dVar24 = pow(((double)(lVar10 * lVar13) * (double)lVar19) / (double)(local_100 * 10),
               0.3333333333333333);
  lVar21 = (long)dVar24;
  lVar18 = 0x20;
  if (0x20 < lVar21) {
    lVar18 = lVar21;
  }
  uVar8 = 0x10 / *(ulong *)(&uleb128_001d8598 + atype * 0x10);
  if (lVar21 < 0x101) {
    lVar18 = uVar8 * 4 + 0x30000;
    lVar13 = 0x100;
    lVar10 = 0x100;
    lVar21 = 0x100;
  }
  else {
    local_110 = lVar18;
    avail = pnga_memory_avail_type(atype);
    lVar5 = pnga_is_mirrored(local_1b0);
    fflush(_stdout);
    if (lVar5 == 0) {
      IVar4 = pnga_type_f2c(0x3f2);
      pnga_gop(IVar4,&avail,1,"min");
    }
    else {
      armci_msg_gop_scope(0x151,&avail,1,"min",-0x65);
      fflush(_stdout);
    }
    lVar21 = local_110;
    if ((avail < 0x40) && (IVar4 = pnga_nodeid(), IVar4 == 0)) {
      pnga_error("NotEnough memory",avail);
    }
    lVar18 = (long)((double)avail * 0.9);
    dVar24 = (double)((lVar18 + -4) / 3);
    if (dVar24 < 0.0) {
      dVar1 = sqrt(dVar24);
    }
    else {
      dVar1 = SQRT(dVar24);
    }
    if ((long)dVar1 < lVar21) {
      if (dVar24 < 0.0) {
        dVar24 = sqrt(dVar24);
      }
      else {
        dVar24 = SQRT(dVar24);
      }
      lVar21 = (long)dVar24;
    }
    if (lVar21 <= lVar13) {
      lVar13 = lVar21;
    }
    if (lVar21 <= lVar10) {
      lVar10 = lVar21;
    }
    if (lVar19 < lVar21) {
      lVar21 = lVar19;
    }
  }
  local_c8 = lVar13;
  pvVar9 = pnga_malloc(lVar18,(int)atype,"GA mulmat bufs");
  lVar18 = local_108;
  lVar13 = ((lVar21 * lVar13) / (long)uVar8) * 0x10;
  if (atype == 0x3ec) {
    bVar22 = NAN(*beta);
    bVar23 = *beta == 0.0;
LAB_00134e7f:
    if ((bVar23) && (!bVar22)) {
      bVar22 = true;
      goto LAB_00134e89;
    }
  }
  else {
    if (atype != 0x3ee) {
      if (atype == 0x3ef) {
        if ((*beta != 0.0) || (NAN(*beta))) goto LAB_00134e87;
        bVar22 = NAN(*(double *)((long)beta + 8));
        bVar23 = *(double *)((long)beta + 8) == 0.0;
      }
      else {
        bVar22 = NAN(*beta);
        bVar23 = *beta == 0.0;
      }
      goto LAB_00134e7f;
    }
    if ((*beta == 0.0) && (!NAN(*beta))) {
      bVar22 = NAN(*(float *)((long)beta + 4));
      bVar23 = *(float *)((long)beta + 4) == 0.0;
      goto LAB_00134e7f;
    }
  }
LAB_00134e87:
  bVar22 = false;
LAB_00134e89:
  lVar19 = ((lVar10 * lVar21) / (long)uVar8) * 0x10;
  local_1c0 = pvVar9;
  local_110 = lVar21;
  local_78 = lVar10;
  pnga_mask_sync(0,0);
  avail = cilo;
  local_1d0 = cjlo;
  local_188 = cihi;
  local_180 = cjhi;
  if (bVar22) {
    pnga_fill_patch(g_c,&avail,&local_188,beta);
  }
  else {
    pnga_scale_patch(g_c,&avail,&local_188,beta);
  }
  pvVar3 = local_1c0;
  buf = (void *)((long)local_1c0 + lVar13 + 0x10);
  buf_00 = (undefined8 *)((long)pvVar9 + lVar19 + lVar13 + 0x20);
  lVar13 = lVar13 + lVar19 + 0x20;
  lVar15 = 0;
  local_a8 = 0;
  lVar10 = local_c0;
  lVar21 = 0;
  lVar19 = local_c8;
  IVar4 = local_1a8;
  while (lVar21 <= local_70) {
    local_68 = local_78 + lVar21;
    local_58 = lVar21 + -1 + local_78;
    if (local_70 < local_68) {
      local_58 = local_70;
    }
    jdim = (local_58 - lVar21) + 1;
    local_e0 = bjlo + lVar21;
    local_e8 = bjlo + local_58;
    local_50 = lVar21 + cjlo;
    local_58 = local_58 + cjlo;
    lVar11 = 0;
    while (lVar21 = local_68, lVar11 <= lVar18) {
      local_60 = lVar11 + local_110;
      local_d8 = lVar11 + -1 + local_110;
      if (lVar18 < local_60) {
        local_d8 = lVar18;
      }
      kdim = (local_d8 - lVar11) + 1;
      local_b0 = lVar11 + ajlo;
      local_b8 = ajlo + local_d8;
      local_d0 = lVar11 + bilo;
      local_d8 = local_d8 + bilo;
      lVar21 = 1;
      lVar17 = lVar21;
      lVar20 = 0;
      while (lVar11 = local_60, lVar18 = local_108, lVar20 <= lVar10) {
        lVar18 = lVar19 + lVar20;
        if (lVar15 % local_100 == IVar4) {
          lVar19 = lVar18 + -1;
          if (lVar10 < lVar18) {
            lVar19 = lVar10;
          }
          cdim = (lVar19 - lVar20) + 1;
          if (atype == 0x3eb) {
            lVar10 = jdim * (lVar19 + lVar21);
            if (lVar10 < 1) {
              lVar10 = 0;
            }
            for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
              *(undefined4 *)((long)pvVar3 + lVar11 * 4 + lVar13) = 0;
            }
          }
          else if (atype == 0x3ec) {
            lVar10 = jdim * (lVar19 + lVar21);
            if (lVar10 < 1) {
              lVar10 = 0;
            }
            for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
              *(undefined8 *)((long)pvVar3 + lVar11 * 8 + lVar13) = 0;
            }
          }
          else if (atype == 0x3ee) {
            lVar10 = jdim * (lVar19 + lVar21);
            if (lVar10 < 1) {
              lVar10 = 0;
            }
            for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
              *(undefined8 *)((long)pvVar3 + lVar11 * 8 + lVar13) = 0;
            }
          }
          else {
            lVar10 = jdim * (lVar19 + lVar21);
            puVar12 = buf_00;
            if (lVar10 < 1) {
              lVar10 = 0;
            }
            while (bVar22 = lVar10 != 0, lVar10 = lVar10 + -1, bVar22) {
              *puVar12 = 0;
              puVar12[1] = 0;
              puVar12 = puVar12 + 2;
            }
          }
          if ((*local_190 | 0x20) == 0x6e) {
            pIVar16 = &idim;
            avail = local_1a0 + lVar20;
            local_1d0 = local_b0;
            local_188 = lVar19 + local_1a0;
            local_180 = local_b8;
            lVar10 = cdim;
          }
          else {
            local_1d0 = local_1a0 + lVar20;
            local_180 = lVar19 + local_1a0;
            pIVar16 = &kdim;
            avail = local_b0;
            local_188 = local_b8;
            lVar10 = kdim;
          }
          idim = cdim;
          local_48 = lVar21;
          pnga_get(local_1b0,&avail,&local_188,local_1c0,pIVar16);
          if (lVar17 != 0) {
            pIVar16 = &kdim;
            avail = local_d0;
            local_1d0 = local_e0;
            local_188 = local_d8;
            local_180 = local_e8;
            if ((*local_198 | 0x20) != 0x6e) {
              pIVar16 = &jdim;
              avail = local_e0;
              local_1d0 = local_d0;
              local_188 = local_e8;
              local_180 = local_d8;
            }
            local_a8 = *pIVar16;
            pnga_get(g_b,&avail,&local_188,buf,pIVar16);
          }
          idim_t = idim;
          jdim_t = jdim;
          kdim_t = kdim;
          bdim_t = local_a8;
          cdim_t = cdim;
          adim_t = lVar10;
          switch(atype) {
          case 0x3eb:
            gal_sgemm_(local_190,local_198,&idim_t,&jdim_t,&kdim_t,local_150,local_1c0,&adim_t,buf,
                       &bdim_t,&local_158,buf_00,&cdim_t,1,1);
            break;
          case 0x3ec:
            gal_dgemm_(local_190,local_198,&idim_t,&jdim_t,&kdim_t,local_150,local_1c0,&adim_t,buf,
                       &bdim_t,&local_88,buf_00,&cdim_t,1,1);
            break;
          default:
            pnga_error("ga_matmul_patch: wrong data type",atype);
            break;
          case 0x3ee:
            gal_cgemm_(local_190,local_198,&idim_t,&jdim_t,&kdim_t,local_150,local_1c0,&adim_t,buf,
                       &bdim_t,&local_158,buf_00,&cdim_t,1,1);
            break;
          case 0x3ef:
            gal_zgemm_(local_190,local_198,&idim_t,&jdim_t,&kdim_t,local_150,local_1c0,&adim_t,buf,
                       &bdim_t,&local_88,buf_00,&cdim_t,1,1);
          }
          IVar4 = local_1a8;
          puVar12 = &local_158;
          if ((atype != 0x3eb) && (atype != 0x3ee)) {
            puVar12 = &local_88;
          }
          avail = lVar20 + cilo;
          local_188 = lVar19 + cilo;
          local_1d0 = local_50;
          local_180 = local_58;
          pnga_acc(g_c,&avail,&local_188,buf_00,&cdim,puVar12);
          lVar17 = 0;
          lVar10 = local_c0;
          lVar19 = local_c8;
          lVar21 = local_48;
        }
        lVar15 = lVar15 + 1;
        lVar21 = lVar21 - lVar19;
        lVar20 = lVar18;
      }
    }
  }
  pnga_free(local_1c0);
  if (local_ec != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_matmul_mirrored(transa, transb, alpha, beta,
			g_a, ailo, aihi, ajlo, ajhi,
			g_b, bilo, bihi, bjlo, bjhi,
			g_c, cilo, cihi, cjlo, cjhi)

     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{

    #ifdef STATBUF
  /* approx. sqrt(2) ratio in chunk size to use the same buffer space */
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2], rank;
Integer me= pnga_nodeid(), nproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, adim, bdim=0, cdim;
Integer Ichunk, Kchunk, Jchunk;
DoubleComplex ONE;
SingleComplex ONE_CF;

DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int need_scaling=1;
Integer ZERO_I = 0, inode, iproc;
Integer get_new_B;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
Integer clo[2], chi[2];

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;

   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();


   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &rank, dims); 
   VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
   pnga_inquire(g_b, &btype, &rank, dims); 
   VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
   pnga_inquire(g_c, &ctype, &rank, dims); 
   VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   
   
   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
     if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error("  g_a indices out of range ", g_a);
   }else
     if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
       pnga_error("  g_a indices out of range ", g_a);
   
   if (*transb == 'n' || *transb == 'N'){
     if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error("  g_b indices out of range ", g_b);
   }else
     if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
       pnga_error("  g_b indices out of range ", g_b);
   
   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
     pnga_error("  g_c indices out of range ", g_c);
   
   /* verify if patch dimensions are consistent */
   m = aihi - ailo +1;
   n = bjhi - bjlo +1;
   k = ajhi - ajlo +1;
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   

   /* In 32-bit platforms, k*m*n might exceed the "long" range(2^31), 
      eg:k=m=n=1600. So casting the temporary value to "double" helps */
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;

#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     /**
      * Find out how much memory we can grab.  It will be used in
      * three chunks, and the result includes only the first one.
      */
     
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       if (pnga_is_mirrored(g_a)) {
         fflush(stdout);
         if (sizeof(Integer)/sizeof(int) > 1)
           armci_msg_gop_scope(SCOPE_NODE, &avail, 1, "min", ARMCI_LONG);
         else
           armci_msg_gop_scope(SCOPE_NODE, &avail, 1, "min", ARMCI_INT);
         fflush(stdout);
       } else {
         fflush(stdout);
         pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       }
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("NotEnough memory",avail);
       elems = (Integer)(avail*0.9); /* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;
     
     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0) need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   pnga_mask_sync(ZERO_I, ZERO_I);
   clo[0] = cilo; clo[1] = cjlo;
   chi[0] = cihi; chi[1] = cjhi;
   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else  pnga_fill_patch(g_c, clo, chi, beta);

   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;

       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);          /* loop rows of g_b patch */
	 kdim= khi - klo +1;                                     
	 
	 /** Each pass through the outer two loops means we need a
	     different patch of B.*/
	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){

	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype ==  C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
	     else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_get(g_a, clo, chi, a, &idim);
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_get(g_a, clo, chi, a, &kdim);
	     }


	     /* Avoid rereading B if it is the same patch as last time. */
        if(get_new_B) { 
          if (*transb == 'n' || *transb == 'N'){ 
            bdim = kdim;
            i0= bilo+klo; i1= bilo+khi;   
            j0= bjlo+jlo; j1= bjlo+jhi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_get(g_b, clo, chi, b, &kdim);
          }else{
            bdim = jdim;
            i0= bjlo+jlo; i1= bjlo+jhi;   
            j0= bilo+klo; j1= bilo+khi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_get(g_b, clo, chi, b, &jdim);
          }
          get_new_B = FALSE; /* Until J or K change again */
        }

	     
	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

	     switch(atype) {
	     case C_FLOAT:
	       BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (Real *)alpha, (Real *)a, &adim_t,
              (Real *)b, &bdim_t, (Real *)&ONE_CF,
              (Real *)c, &cdim_t);
	       break;
	     case C_DBL:
	       BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
              (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
              (DoublePrecision *)c, &cdim_t);
	       break;
	     case C_DCPL:
	       BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
              (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
              (DoubleComplex *)c, &cdim_t);
	       break;
	     case C_SCPL:
	       BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
		      (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
              (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
              (SingleComplex *)c, &cdim_t);
	       break;
	     default:
	       pnga_error("ga_matmul_patch: wrong data type", atype);
	     }
	     
	     i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
	     if(atype == C_FLOAT || atype == C_SCPL)  {
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_acc(g_c, clo, chi, (float *)c, &cdim, &ONE_CF);
        } else {
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
	       pnga_acc(g_c, clo, chi, (DoublePrecision*)c, &cdim, (DoublePrecision*)&ONE);
        }
	   }
	   ++ijk;
	 }
       }
   }
   
#ifndef STATBUF
   pnga_free(a);
#endif

   if(local_sync_end)pnga_sync();

}